

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archivable_dictionary.cpp
# Opt level: O2

void __thiscall
ON_ArchivableDictionary::CopyValues(ON_ArchivableDictionary *this,ON_ArchivableDictionary *source)

{
  ON_ArchivableDictionaryPrivate *pOVar1;
  DictionaryEntry *pDVar2;
  mapped_type *pmVar3;
  DictionaryEntry *pDVar4;
  _Base_ptr p_Var5;
  
  if (this != source) {
    pOVar1 = source->m_private;
    for (p_Var5 = (pOVar1->m_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &(pOVar1->m_map)._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      pmVar3 = std::
               map<ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>,_std::less<void>,_std::allocator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>_>
               ::operator[](&this->m_private->m_map,(key_type *)(p_Var5 + 1));
      pDVar4 = (DictionaryEntry *)(**(code **)(*(long *)p_Var5[1]._M_parent + 0x18))();
      pDVar2 = (pmVar3->_M_t).
               super___uniq_ptr_impl<DictionaryEntry,_std::default_delete<DictionaryEntry>_>._M_t.
               super__Tuple_impl<0UL,_DictionaryEntry_*,_std::default_delete<DictionaryEntry>_>.
               super__Head_base<0UL,_DictionaryEntry_*,_false>._M_head_impl;
      (pmVar3->_M_t).super___uniq_ptr_impl<DictionaryEntry,_std::default_delete<DictionaryEntry>_>.
      _M_t.super__Tuple_impl<0UL,_DictionaryEntry_*,_std::default_delete<DictionaryEntry>_>.
      super__Head_base<0UL,_DictionaryEntry_*,_false>._M_head_impl = pDVar4;
      if (pDVar2 != (DictionaryEntry *)0x0) {
        (*pDVar2->_vptr_DictionaryEntry[1])();
      }
    }
  }
  return;
}

Assistant:

void ON_ArchivableDictionary::CopyValues(const ON_ArchivableDictionary& source)
{
  if (this != &source)
  {
    for (const auto& entry : source.m_private->m_map)
      m_private->m_map[entry.first].reset(entry.second->Duplicate());
  }
}